

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O0

void stbir__choose_filter(stbir__info *info,stbir_filter h_filter,stbir_filter v_filter)

{
  int iVar1;
  stbir_filter local_18;
  stbir_filter local_14;
  stbir_filter v_filter_local;
  stbir_filter h_filter_local;
  stbir__info *info_local;
  
  local_14 = h_filter;
  if (h_filter == STBIR_FILTER_DEFAULT) {
    iVar1 = stbir__use_upsampling(info->horizontal_scale);
    local_14 = STBIR_FILTER_MITCHELL;
    if (iVar1 != 0) {
      local_14 = STBIR_FILTER_CATMULLROM;
    }
  }
  local_18 = v_filter;
  if (v_filter == STBIR_FILTER_DEFAULT) {
    iVar1 = stbir__use_upsampling(info->vertical_scale);
    local_18 = STBIR_FILTER_MITCHELL;
    if (iVar1 != 0) {
      local_18 = STBIR_FILTER_CATMULLROM;
    }
  }
  info->horizontal_filter = local_14;
  info->vertical_filter = local_18;
  return;
}

Assistant:

static void stbir__choose_filter(stbir__info *info, stbir_filter h_filter, stbir_filter v_filter)
{
    if (h_filter == 0)
        h_filter = stbir__use_upsampling(info->horizontal_scale) ? STBIR_DEFAULT_FILTER_UPSAMPLE : STBIR_DEFAULT_FILTER_DOWNSAMPLE;
    if (v_filter == 0)
        v_filter = stbir__use_upsampling(info->vertical_scale)   ? STBIR_DEFAULT_FILTER_UPSAMPLE : STBIR_DEFAULT_FILTER_DOWNSAMPLE;
    info->horizontal_filter = h_filter;
    info->vertical_filter = v_filter;
}